

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::setKernelArgUSMPointer(CLIntercept *this,cl_kernel kernel,cl_uint arg_index,void *arg)

{
  mutex *__mutex;
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  mapped_type pvVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  mapped_type *this_00;
  mapped_type *ppvVar6;
  undefined8 uVar7;
  cl_uint local_2c;
  cl_kernel local_28;
  
  __mutex = &this->m_Mutex;
  local_2c = arg_index;
  local_28 = kernel;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    if ((this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var1 = &(this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var1->_M_header;
      for (; p_Var2 != (_Rb_tree_node_base *)0x0;
          p_Var2 = (&p_Var2->_M_left)[*(void **)(p_Var2 + 1) < arg]) {
        if (*(void **)(p_Var2 + 1) >= arg) {
          p_Var5 = p_Var2;
        }
      }
      if (((_Rb_tree_header *)p_Var5 == p_Var1) ||
         ((*(void **)(p_Var5 + 1) != arg &&
          (p_Var5 != (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
          ))) {
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var5);
      }
      pvVar3 = *(mapped_type *)(p_Var5 + 1);
      if ((pvVar3 <= arg) && (arg < (void *)((long)&(p_Var5[1]._M_parent)->_M_color + (long)pvVar3))
         ) {
        this_00 = std::
                  map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
                  ::operator[](&this->m_KernelArgMemMap,&local_28);
        ppvVar6 = std::
                  map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                  ::operator[](this_00,&local_2c);
        *ppvVar6 = pvVar3;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar7 = std::__throw_system_error(iVar4);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar7);
}

Assistant:

void CLIntercept::setKernelArgUSMPointer(
    cl_kernel kernel,
    cl_uint arg_index,
    const void* arg )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( m_USMAllocInfoMap.empty() )
    {
        return;
    }

    CUSMAllocInfoMap::iterator iter = m_USMAllocInfoMap.lower_bound( arg );
    if( iter == m_USMAllocInfoMap.end() || (iter->first != arg && iter != m_USMAllocInfoMap.begin()) )
    {
        // Go to the previous iterator.
        --iter;
    }

    const void* startPtr = iter->first;
    const void* endPtr = (const char*)startPtr + iter->second;
    if( arg >= startPtr && arg < endPtr )
    {
        CArgMemMap& argMemMap = m_KernelArgMemMap[ kernel ];
        argMemMap[ arg_index ] = startPtr;
    }
}